

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O2

bool __thiscall IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(PropertySymOpnd *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = IsTypeCheckSeqCandidate(this);
  bVar2 = true;
  if (!bVar1) {
    if (((this->field_12).objTypeSpecFlags & 0x4a00) == 0) {
      bVar2 = ((this->field_12).objTypeSpecFlags & 0x400) == 0;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool TypeCheckSeqBitsSetOnlyIfCandidate() const
    {
        return IsTypeCheckSeqCandidate() || (!IsTypeAvailable() && !IsTypeChecked() && !IsWriteGuardChecked() && !IsTypeDead());
    }